

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fAttribLocationTests.cpp
# Opt level: O1

TestCaseGroup * deqp::gles2::Functional::createAttributeLocationTests(Context *context)

{
  TestCaseGroup *this;
  TestNode *pTVar1;
  BindAttributeTest *this_00;
  BindMaxAttributesTest *this_01;
  BindAliasingAttributeTest *pBVar2;
  BindMaxAliasingAttributeTest *this_02;
  BindInactiveAliasingAttributeTest *this_03;
  BindHoleAttributeTest *this_04;
  PreAttachBindAttributeTest *this_05;
  PreLinkBindAttributeTest *this_06;
  PostLinkBindAttributeTest *this_07;
  BindRelinkAttributeTest *this_08;
  BindReattachAttributeTest *this_09;
  BindRelinkHoleAttributeTest *this_10;
  AttribType *type;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  AttribType local_148 [4];
  AttribType local_a8;
  AttribType local_80;
  AttribType local_58;
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"float","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_148,&local_1e8,1,0x1406);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"vec2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_148 + 1,&local_168,1,0x8b50);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"vec3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_148 + 2,&local_208,1,0x8b51);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"vec4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_148 + 3,&local_228,1,0x8b52);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"mat2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_a8,&local_188,2,0x8b5a);
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"mat3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_80,&local_1a8,3,0x8b5b);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"mat4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_58,&local_1c8,4,0x8b5c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  this = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"attribute_location",
             "Attribute location tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  this->m_context = context;
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"bind","Basic attribute binding tests.");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  lVar3 = 0;
  do {
    this_00 = (BindAttributeTest *)operator_new(0xa8);
    deqp::gls::BindAttributeTest::BindAttributeTest
              (this_00,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_148[0].m_name._M_dataplus._M_p + lVar3),-1);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x118);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"bind_max_attributes",
             "Test using maximum attributes with bind.");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  lVar3 = 0;
  do {
    this_01 = (BindMaxAttributesTest *)operator_new(0xa8);
    deqp::gls::BindMaxAttributesTest::BindMaxAttributesTest
              (this_01,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_148[0].m_name._M_dataplus._M_p + lVar3),-1);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_01);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x118);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"bind_aliasing",
             "Test attribute location aliasing with bind.");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  lVar3 = 0;
  do {
    pBVar2 = (BindAliasingAttributeTest *)operator_new(0xa8);
    type = (AttribType *)((long)&local_148[0].m_name._M_dataplus._M_p + lVar3);
    deqp::gls::BindAliasingAttributeTest::BindAliasingAttributeTest
              (pBVar2,context->m_testCtx,context->m_renderCtx,type,0,-1);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pBVar2);
    if (1 < *(uint *)((long)&local_148[0].m_locationSize + lVar3)) {
      pBVar2 = (BindAliasingAttributeTest *)operator_new(0xa8);
      deqp::gls::BindAliasingAttributeTest::BindAliasingAttributeTest
                (pBVar2,context->m_testCtx,context->m_renderCtx,type,1,-1);
      tcu::TestNode::addChild(pTVar1,(TestNode *)pBVar2);
    }
    this_02 = (BindMaxAliasingAttributeTest *)operator_new(0xa8);
    deqp::gls::BindMaxAliasingAttributeTest::BindMaxAliasingAttributeTest
              (this_02,context->m_testCtx,context->m_renderCtx,type,-1);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_02);
    this_03 = (BindInactiveAliasingAttributeTest *)operator_new(0xa8);
    deqp::gls::BindInactiveAliasingAttributeTest::BindInactiveAliasingAttributeTest
              (this_03,context->m_testCtx,context->m_renderCtx,type,-1);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_03);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x118);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"bind_hole",
             "Bind all, but one attribute and leave hole in location space for it.");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  lVar3 = 0;
  do {
    this_04 = (BindHoleAttributeTest *)operator_new(0xa8);
    deqp::gls::BindHoleAttributeTest::BindHoleAttributeTest
              (this_04,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_148[0].m_name._M_dataplus._M_p + lVar3),-1);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_04);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x118);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"bind_time",
             "Bind time tests. Test binding at different stages.");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_05 = (PreAttachBindAttributeTest *)operator_new(0x78);
  deqp::gls::PreAttachBindAttributeTest::PreAttachBindAttributeTest
            (this_05,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_05);
  this_06 = (PreLinkBindAttributeTest *)operator_new(0x78);
  deqp::gls::PreLinkBindAttributeTest::PreLinkBindAttributeTest
            (this_06,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_06);
  this_07 = (PostLinkBindAttributeTest *)operator_new(0x78);
  deqp::gls::PostLinkBindAttributeTest::PostLinkBindAttributeTest
            (this_07,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_07);
  this_08 = (BindRelinkAttributeTest *)operator_new(0x78);
  deqp::gls::BindRelinkAttributeTest::BindRelinkAttributeTest
            (this_08,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_08);
  this_09 = (BindReattachAttributeTest *)operator_new(0x78);
  deqp::gls::BindReattachAttributeTest::BindReattachAttributeTest
            (this_09,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_09);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"bind_relink_hole",
             "Test relinking with moving hole in attribute location space.");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0215e3d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  lVar3 = 0;
  do {
    this_10 = (BindRelinkHoleAttributeTest *)operator_new(0xa8);
    deqp::gls::BindRelinkHoleAttributeTest::BindRelinkHoleAttributeTest
              (this_10,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_148[0].m_name._M_dataplus._M_p + lVar3),-1);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_10);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x118);
  lVar3 = -0x118;
  paVar4 = &local_58.m_name.field_2;
  do {
    if (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar4->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar4->_M_allocated_capacity)[-2],paVar4->_M_allocated_capacity + 1
                     );
    }
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar4->_M_allocated_capacity + -5);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0);
  return this;
}

Assistant:

TestCaseGroup* createAttributeLocationTests (Context& context)
{
	const AttribType	types[] =
	{
		AttribType("float",	1,  GL_FLOAT),
		AttribType("vec2",	1,  GL_FLOAT_VEC2),
		AttribType("vec3",	1,  GL_FLOAT_VEC3),
		AttribType("vec4",	1,  GL_FLOAT_VEC4),

		AttribType("mat2",	2,  GL_FLOAT_MAT2),
		AttribType("mat3",	3,  GL_FLOAT_MAT3),
		AttribType("mat4",	4,  GL_FLOAT_MAT4)
	};

	TestCaseGroup* const root = new TestCaseGroup (context, "attribute_location", "Attribute location tests");

	// Basic bind attribute tests
	{
		TestCaseGroup* const bindAttributeGroup = new TestCaseGroup(context, "bind", "Basic attribute binding tests.");

		root->addChild(bindAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			bindAttributeGroup->addChild(new gls::BindAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Bind max number of attributes
	{
		TestCaseGroup* const bindMaxAttributeGroup = new TestCaseGroup(context, "bind_max_attributes", "Test using maximum attributes with bind.");

		root->addChild(bindMaxAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			bindMaxAttributeGroup->addChild(new gls::BindMaxAttributesTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test aliasing
	{
		TestCaseGroup* const aliasingGroup = new TestCaseGroup(context, "bind_aliasing", "Test attribute location aliasing with bind.");

		root->addChild(aliasingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			// Simple aliasing cases
			aliasingGroup->addChild(new gls::BindAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));

			// For types which occupy more than one location. Alias second location.
			if (type.getLocationSize() > 1)
				aliasingGroup->addChild(new gls::BindAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type, 1));

			// Use more than maximum attributes with conditional aliasing
			aliasingGroup->addChild(new gls::BindMaxAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));

			// Use more than maximum attributes with inactive attributes
			aliasingGroup->addChild(new gls::BindInactiveAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test filling holes in attribute location
	{
		TestCaseGroup* const holeGroup = new TestCaseGroup(context, "bind_hole", "Bind all, but one attribute and leave hole in location space for it.");

		root->addChild(holeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			// Bind first location, leave hole size of type and fill rest of locations
			holeGroup->addChild(new gls::BindHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test binding at different times
	{
		TestCaseGroup* const bindTimeGroup = new TestCaseGroup(context, "bind_time", "Bind time tests. Test binding at different stages.");

		root->addChild(bindTimeGroup);

		bindTimeGroup->addChild(new gls::PreAttachBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::PreLinkBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::PostLinkBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::BindRelinkAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::BindReattachAttributeTest(context.getTestContext(), context.getRenderContext()));
	}

	// Test relinking program
	{
		TestCaseGroup* const relinkHoleGroup = new TestCaseGroup(context, "bind_relink_hole", "Test relinking with moving hole in attribute location space.");

		root->addChild(relinkHoleGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			relinkHoleGroup->addChild(new gls::BindRelinkHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	return root;
}